

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteKvIoPageUnRef(unqlite_page *pPage)

{
  unqlite_page *pPage_local;
  
  if (pPage != (unqlite_page *)0x0) {
    page_unref((Page *)pPage);
  }
  return 0;
}

Assistant:

static int unqliteKvIoPageUnRef(unqlite_page *pPage)
{
	if( pPage ){
		page_unref((Page *)pPage);
	}
	return UNQLITE_OK;
}